

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::WireFormatLite::VerifyUtf8String
          (WireFormatLite *this,char *data,int size,Operation op,string_view field_name)

{
  ulong uVar1;
  undefined4 in_register_0000000c;
  string_view message_name;
  string_view field_name_00;
  undefined1 in_stack_ffffffffffffff88;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  char *local_48;
  char *operation_str;
  char *local_38;
  int local_30;
  int local_2c;
  Operation op_local;
  int size_local;
  char *data_local;
  string_view field_name_local;
  
  data_local = (char *)CONCAT44(in_register_0000000c,op);
  field_name_local._M_len = field_name._M_len;
  local_2c = (int)data;
  local_30 = size;
  _op_local = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&operation_str,(char *)this,
             (long)local_2c);
  uVar1 = utf8_range::IsStructurallyValid(operation_str,local_38);
  if ((uVar1 & 1) == 0) {
    local_48 = (char *)0x0;
    if (local_30 == 0) {
      local_48 = "parsing";
    }
    else if (local_30 == 1) {
      local_48 = "serializing";
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"");
    message_name._M_str = data_local;
    message_name._M_len = (size_t)local_58._M_str;
    field_name_00._M_str = local_48;
    field_name_00._M_len = field_name_local._M_len;
    PrintUTF8ErrorLog((internal *)local_58._M_len,message_name,field_name_00,(char *)0x0,
                      (bool)in_stack_ffffffffffffff88);
    field_name_local._M_str._7_1_ = false;
  }
  else {
    field_name_local._M_str._7_1_ = true;
  }
  return field_name_local._M_str._7_1_;
}

Assistant:

bool WireFormatLite::VerifyUtf8String(const char* data, int size, Operation op,
                                      const absl::string_view field_name) {
  if (!utf8_range::IsStructurallyValid({data, static_cast<size_t>(size)})) {
    const char* operation_str = nullptr;
    switch (op) {
      case PARSE:
        operation_str = "parsing";
        break;
      case SERIALIZE:
        operation_str = "serializing";
        break;
        // no default case: have the compiler warn if a case is not covered.
    }
    PrintUTF8ErrorLog("", field_name, operation_str, false);
    return false;
  }
  return true;
}